

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAcurv::ArchiveOUT(ChNodeFEAcurv *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_f0;
  ChNameValue<chrono::ChVector<double>_> local_d8;
  ChNameValue<chrono::ChVector<double>_> local_c0;
  ChNameValue<chrono::ChVector<double>_> local_a8;
  ChNameValue<chrono::ChVector<double>_> local_90;
  ChNameValue<chrono::ChVector<double>_> local_78;
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAcurv>(marchive);
  ChNodeBase::ArchiveOUT
            ((ChNodeBase *)
             ((long)(this->m_ryy).m_data +
             (long)((this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + -0x38)),marchive);
  local_30._value = (ChVector<double> *)&(this->super_ChNodeFEAbase).field_0x20;
  local_30._name = "m_rxx";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->m_ryy;
  local_48._name = "m_ryy";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->m_rzz;
  local_60._name = "m_rzz";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->m_rxx_dt;
  local_78._name = "m_rxx_dt";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &this->m_ryy_dt;
  local_90._name = "m_ryy_dt";
  local_90._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &this->m_rzz_dt;
  local_a8._name = "m_rzz_dt";
  local_a8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._value = &this->m_rxx_dtdt;
  local_c0._name = "m_rxx_dtdt";
  local_c0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._value = &this->m_ryy_dtdt;
  local_d8._name = "m_ryy_dtdt";
  local_d8._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_d8);
  local_f0._value = &this->m_rzz_dtdt;
  local_f0._name = "m_rzz_dtdt";
  local_f0._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_f0);
  return;
}

Assistant:

void ChNodeFEAcurv::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAcurv>();
    // serialize parent class
    ChNodeFEAbase::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_rxx);
    marchive << CHNVP(m_ryy);
    marchive << CHNVP(m_rzz);
    marchive << CHNVP(m_rxx_dt);
    marchive << CHNVP(m_ryy_dt);
    marchive << CHNVP(m_rzz_dt);
    marchive << CHNVP(m_rxx_dtdt);
    marchive << CHNVP(m_ryy_dtdt);
    marchive << CHNVP(m_rzz_dtdt);
}